

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::Postprocess_BuildNode
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiNode *pSceneNode,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList,
          list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList,
          list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList)

{
  uint uVar1;
  EType EVar2;
  CX3DImporter_NodeElement *pNodeElement_00;
  long lVar3;
  _func_int **pp_Var4;
  pointer pcVar5;
  size_type sVar6;
  undefined8 uVar7;
  _List_node_base *p_Var8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  size_t i;
  ulong uVar12;
  aiNode *this_00;
  aiNode **ppaVar13;
  uint *puVar14;
  DeadlyImportError *this_01;
  _List_node_base *p_Var15;
  const_iterator it;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  size_t sVar18;
  bool bVar19;
  list<unsigned_int,_std::allocator<unsigned_int>_> SceneNode_Mesh;
  list<aiNode_*,_std::allocator<aiNode_*>_> SceneNode_Child;
  aiNode *new_node;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var16 = (pNodeElement->Child).
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&SceneNode_Child;
  SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&SceneNode_Mesh;
  SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  _M_size = 0;
  SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
       super__List_node_base._M_next;
  SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  Postprocess_CollectMetadata(this,pNodeElement,pSceneNode);
  p_Var17 = (_List_node_base *)&pNodeElement->Child;
  p_Var15 = p_Var16;
  if (pNodeElement->Type == ENET_Group) {
    pp_Var4 = pNodeElement[1]._vptr_CX3DImporter_NodeElement;
    EVar2 = pNodeElement[1].Type;
    uVar11 = *(undefined4 *)&pNodeElement[1].field_0xc;
    pcVar5 = pNodeElement[1].ID._M_dataplus._M_p;
    uVar9 = *(undefined4 *)&pNodeElement[1].ID._M_string_length;
    uVar10 = *(undefined4 *)((long)&pNodeElement[1].ID._M_string_length + 4);
    sVar6 = pNodeElement[1].ID.field_2._M_allocated_capacity;
    uVar7 = *(undefined8 *)((long)&pNodeElement[1].ID.field_2 + 8);
    p_Var8 = pNodeElement[1].Child.
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    *(CX3DImporter_NodeElement **)&(pSceneNode->mTransformation).d1 = pNodeElement[1].Parent;
    *(_List_node_base **)&(pSceneNode->mTransformation).d3 = p_Var8;
    (pSceneNode->mTransformation).c1 = (float)(int)sVar6;
    (pSceneNode->mTransformation).c2 = (float)(int)(sVar6 >> 0x20);
    (pSceneNode->mTransformation).c3 = (float)(int)uVar7;
    (pSceneNode->mTransformation).c4 = (float)(int)((ulong)uVar7 >> 0x20);
    *(pointer *)&(pSceneNode->mTransformation).b1 = pcVar5;
    (pSceneNode->mTransformation).b3 = (float)uVar9;
    (pSceneNode->mTransformation).b4 = (float)uVar10;
    *(_func_int ***)&pSceneNode->mTransformation = pp_Var4;
    (pSceneNode->mTransformation).a3 = (float)EVar2;
    (pSceneNode->mTransformation).a4 = (float)uVar11;
    if (((*(char *)((long)&pNodeElement[1].Child.
                           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                           ._M_impl._M_node.super__List_node_base._M_prev + 1) == '\x01') &&
        (uVar1 = *(uint *)((long)&pNodeElement[1].Child.
                                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev + 4),
        uVar12 = (ulong)uVar1, p_Var15 = p_Var17, -1 < (int)uVar1)) &&
       (uVar12 < (pNodeElement->Child).
                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                 ._M_impl._M_node._M_size)) {
      do {
        p_Var15 = p_Var16;
        p_Var17 = p_Var15->_M_next;
        bVar19 = uVar12 != 0;
        uVar12 = uVar12 - 1;
        p_Var16 = p_Var17;
      } while (bVar19);
    }
  }
  do {
    sVar18 = SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
             _M_size;
    p_Var16 = SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
    if (p_Var15 == p_Var17) {
      if (SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)&SceneNode_Child) {
        pSceneNode->mNumChildren =
             (uint)SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   _M_node._M_size;
        ppaVar13 = (aiNode **)
                   operator_new__((SceneNode_Child.
                                   super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                   _M_node._M_size & 0xffffffff) << 3);
        pSceneNode->mChildren = ppaVar13;
        for (uVar12 = 0; uVar12 < (sVar18 & 0xffffffff); uVar12 = uVar12 + 1) {
          p_Var17 = p_Var16 + 1;
          p_Var16 = p_Var16->_M_next;
          pSceneNode->mChildren[uVar12] = (aiNode *)p_Var17->_M_next;
          sVar18 = (size_t)pSceneNode->mNumChildren;
        }
      }
      sVar18 = SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               _M_node._M_size;
      p_Var17 = SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                ._M_node.super__List_node_base._M_next;
      if (SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          _M_node.super__List_node_base._M_next != (_List_node_base *)&SceneNode_Mesh) {
        pSceneNode->mNumMeshes =
             (uint)SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl._M_node._M_size;
        puVar14 = (uint *)operator_new__((SceneNode_Mesh.
                                          super__List_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl._M_node._M_size & 0xffffffff) << 2);
        pSceneNode->mMeshes = puVar14;
        for (uVar12 = 0; uVar12 < (sVar18 & 0xffffffff); uVar12 = uVar12 + 1) {
          p_Var16 = p_Var17 + 1;
          p_Var17 = p_Var17->_M_next;
          pSceneNode->mMeshes[uVar12] = *(uint *)&p_Var16->_M_next;
          sVar18 = (size_t)pSceneNode->mNumMeshes;
        }
      }
      std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
                (&SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear
                (&SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>);
      return;
    }
    pNodeElement_00 = (CX3DImporter_NodeElement *)p_Var15[1]._M_next;
    EVar2 = pNodeElement_00->Type;
    if (EVar2 - ENET_DirectionalLight < 3) {
      Postprocess_BuildLight(this,pNodeElement_00,pSceneLightList);
    }
    else if (EVar2 == ENET_Shape) {
      Postprocess_BuildShape
                (this,(CX3DImporter_NodeElement_Shape *)pNodeElement_00,&SceneNode_Mesh,
                 pSceneMeshList,pSceneMaterialList);
    }
    else if (EVar2 == ENET_Group) {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      lVar3 = (long)p_Var15[1]._M_next;
      uVar12 = *(ulong *)(lVar3 + 0x18);
      new_node = this_00;
      if (uVar12 < 0x400) {
        (this_00->mName).length = (ai_uint32)uVar12;
        memcpy((this_00->mName).data,*(void **)(lVar3 + 0x10),uVar12);
        (this_00->mName).data[uVar12] = '\0';
      }
      this_00->mParent = pSceneNode;
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&SceneNode_Child,&new_node)
      ;
      Postprocess_BuildNode
                (this,(CX3DImporter_NodeElement *)p_Var15[1]._M_next,new_node,pSceneMeshList,
                 pSceneMaterialList,pSceneLightList);
    }
    else if (5 < EVar2 - ENET_MetaBoolean) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<CX3DImporter_NodeElement::EType>(&local_70,*(EType *)((long)p_Var15[1]._M_next + 8))
      ;
      std::operator+(&local_50,"Postprocess_BuildNode. Unknown type: ",&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_node,
                     &local_50,".");
      DeadlyImportError::DeadlyImportError(this_01,(string *)&new_node);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var15 = p_Var15->_M_next;
  } while( true );
}

Assistant:

void X3DImporter::Postprocess_BuildNode(const CX3DImporter_NodeElement& pNodeElement, aiNode& pSceneNode, std::list<aiMesh*>& pSceneMeshList,
										std::list<aiMaterial*>& pSceneMaterialList, std::list<aiLight*>& pSceneLightList) const
{
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_begin = pNodeElement.Child.begin();
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_end = pNodeElement.Child.end();
    std::list<aiNode*> SceneNode_Child;
    std::list<unsigned int> SceneNode_Mesh;

	// At first read all metadata
	Postprocess_CollectMetadata(pNodeElement, pSceneNode);
	// check if we have deal with grouping node. Which can contain transformation or switch
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)
	{
		const CX3DImporter_NodeElement_Group& tne_group = *((CX3DImporter_NodeElement_Group*)&pNodeElement);// create alias for convenience

		pSceneNode.mTransformation = tne_group.Transformation;
		if(tne_group.UseChoice)
		{
			// If Choice is less than zero or greater than the number of nodes in the children field, nothing is chosen.
			if((tne_group.Choice < 0) || ((size_t)tne_group.Choice >= pNodeElement.Child.size()))
			{
				chit_begin = pNodeElement.Child.end();
				chit_end = pNodeElement.Child.end();
			}
			else
			{
				for(size_t i = 0; i < (size_t)tne_group.Choice; i++) ++chit_begin;// forward iterator to chosen node.

				chit_end = chit_begin;
				++chit_end;// point end iterator to next element after chosen node.
			}
		}// if(tne_group.UseChoice)
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)

	// Reserve memory for fast access and check children.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; ++it)
	{// in this loop we do not read metadata because it's already read at begin.
		if((*it)->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			// if child is group then create new node and do recursive call.
			aiNode* new_node = new aiNode;

			new_node->mName = (*it)->ID;
			new_node->mParent = &pSceneNode;
			SceneNode_Child.push_back(new_node);
			Postprocess_BuildNode(**it, *new_node, pSceneMeshList, pSceneMaterialList, pSceneLightList);
		}
		else if((*it)->Type == CX3DImporter_NodeElement::ENET_Shape)
		{
			// shape can contain only one geometry and one appearance nodes.
			Postprocess_BuildShape(*((CX3DImporter_NodeElement_Shape*)*it), SceneNode_Mesh, pSceneMeshList, pSceneMaterialList);
		}
		else if(((*it)->Type == CX3DImporter_NodeElement::ENET_DirectionalLight) || ((*it)->Type == CX3DImporter_NodeElement::ENET_PointLight) ||
				((*it)->Type == CX3DImporter_NodeElement::ENET_SpotLight))
		{
			Postprocess_BuildLight(*((CX3DImporter_NodeElement_Light*)*it), pSceneLightList);
		}
		else if(!PostprocessHelper_ElementIsMetadata((*it)->Type))// skip metadata
		{
			throw DeadlyImportError("Postprocess_BuildNode. Unknown type: " + to_string((*it)->Type) + ".");
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; it++)

	// copy data about children and meshes to aiNode.
	if(!SceneNode_Child.empty())
	{
		std::list<aiNode*>::const_iterator it = SceneNode_Child.begin();

		pSceneNode.mNumChildren = static_cast<unsigned int>(SceneNode_Child.size());
		pSceneNode.mChildren = new aiNode*[pSceneNode.mNumChildren];
		for(size_t i = 0; i < pSceneNode.mNumChildren; i++) pSceneNode.mChildren[i] = *it++;
	}

	if(!SceneNode_Mesh.empty())
	{
		std::list<unsigned int>::const_iterator it = SceneNode_Mesh.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(SceneNode_Mesh.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *it++;
	}

	// that's all. return to previous deals
}